

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Server_forEachChildNodeCall
          (UA_Server *server,UA_NodeId parentNodeId,UA_NodeIteratorCallback callback,void *handle)

{
  UA_NodeStoreEntry *pUVar1;
  UA_ReferenceNode *size;
  UA_NodeId *pUVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_NodeStoreEntry **ppUVar5;
  size_t sVar6;
  UA_NodeId *pUVar7;
  void *local_48;
  UA_ReferenceNode *refs;
  void *local_38;
  
  ppUVar5 = findNode(server->nodestore,&parentNodeId);
  if (ppUVar5 == (UA_NodeStoreEntry **)0x0) {
    UVar3 = 0x80330000;
  }
  else {
    pUVar1 = *ppUVar5;
    local_48 = (void *)0x0;
    size = (UA_ReferenceNode *)(pUVar1->node).referencesSize;
    UVar3 = UA_Array_copy((pUVar1->node).references,(size_t)size,&local_48,UA_TYPES + 0x38);
    if (UVar3 == 0) {
      sVar6 = (pUVar1->node).referencesSize;
      local_38 = local_48;
      refs = size;
      if (sVar6 == 0) {
        UVar3 = 0;
      }
      else {
        UVar3 = 0;
        pUVar2 = (UA_NodeId *)(sVar6 * 0x50 + (long)local_48);
        do {
          pUVar7 = (UA_NodeId *)((long)&pUVar2[-4].identifier + 8);
          UVar4 = (*callback)(pUVar2[-2],(UA_Boolean)pUVar2[-3].identifier.guid.data4[0],*pUVar7,
                              handle);
          UVar3 = UVar3 | UVar4;
          sVar6 = sVar6 - 1;
          pUVar2 = pUVar7;
        } while (sVar6 != 0);
      }
      UA_Array_delete(local_38,(size_t)refs,UA_TYPES + 0x38);
    }
  }
  return UVar3;
}

Assistant:

UA_StatusCode
UA_Server_forEachChildNodeCall(UA_Server *server, UA_NodeId parentNodeId,
                               UA_NodeIteratorCallback callback, void *handle) {
    UA_RCU_LOCK();
    const UA_Node *parent = UA_NodeStore_get(server->nodestore, &parentNodeId);
    if(!parent) {
        UA_RCU_UNLOCK();
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* TODO: We need to do an ugly copy of the references array since users may
     * delete references from within the callback. In single-threaded mode this
     * changes the same node we point at here. In multi-threaded mode, this
     * creates a new copy as nodes are truly immutable. */
    UA_ReferenceNode *refs = NULL;
    size_t refssize = parent->referencesSize;
    UA_StatusCode retval = UA_Array_copy(parent->references, parent->referencesSize,
                                         (void**)&refs, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_RCU_UNLOCK();
        return retval;
    }

    for(size_t i = parent->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &refs[i-1];
        retval |= callback(ref->targetId.nodeId, ref->isInverse,
                           ref->referenceTypeId, handle);
    }
    UA_RCU_UNLOCK();

    UA_Array_delete(refs, refssize, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    return retval;
}